

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

opj_bool j2k_read_mco(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                     opj_event_mgr *p_manager)

{
  J2K_MCT_ELEMENT_TYPE JVar1;
  opj_image_t *poVar2;
  opj_simple_mcc_decorrelation_data_t *poVar3;
  opj_mct_data_t *poVar4;
  opj_j2k_v2_t *poVar5;
  OPJ_UINT32 OVar6;
  opj_tcp_v2_t *poVar7;
  OPJ_FLOAT32 *pOVar8;
  void *__ptr;
  int iVar9;
  OPJ_INT32 *pOVar10;
  long lVar11;
  uint uVar12;
  bool bVar13;
  OPJ_UINT32 l_nb_stages;
  OPJ_UINT32 l_tmp;
  opj_j2k_v2_t *local_38;
  
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar7 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar7 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (p_header_size == 0) {
    iVar9 = 1;
  }
  else {
    poVar2 = p_j2k->m_private_image;
    opj_read_bytes_LE(p_header_data,&l_nb_stages,1);
    if (1 < l_nb_stages) {
      opj_event_msg_v2(p_manager,2,"Cannot take in charge multiple transformation stages.\n");
      return 1;
    }
    if (l_nb_stages + 1 == p_header_size) {
      OVar6 = poVar2->numcomps;
      pOVar10 = &poVar7->tccps->m_dc_level_shift;
      while (bVar13 = OVar6 != 0, OVar6 = OVar6 - 1, bVar13) {
        *pOVar10 = 0;
        pOVar10 = pOVar10 + 0x10e;
      }
      if (poVar7->m_mct_decoding_matrix != (OPJ_FLOAT32 *)0x0) {
        free(poVar7->m_mct_decoding_matrix);
        poVar7->m_mct_decoding_matrix = (OPJ_FLOAT32 *)0x0;
      }
      uVar12 = 0;
      local_38 = p_j2k;
      do {
        poVar5 = local_38;
        if (l_nb_stages <= uVar12) {
          return 1;
        }
        p_header_data = p_header_data + 1;
        opj_read_bytes_LE(p_header_data,&l_tmp,1);
        poVar2 = poVar5->m_private_image;
        poVar3 = poVar7->m_mcc_records;
        iVar9 = poVar7->m_nb_mcc_records + 1;
        do {
          iVar9 = iVar9 + -1;
          if (iVar9 == 0) goto LAB_0011e8ff;
        } while (poVar3->m_index != l_tmp);
        OVar6 = poVar3->m_nb_comps;
        if (OVar6 == poVar2->numcomps) {
          poVar4 = poVar3->m_decorrelation_array;
          if (poVar4 != (opj_mct_data_t *)0x0) {
            JVar1 = poVar4->m_element_type;
            OVar6 = OVar6 * OVar6;
            if (poVar4->m_data_size != MCT_ELEMENT_SIZE[JVar1] * OVar6) {
              return 0;
            }
            pOVar8 = (OPJ_FLOAT32 *)malloc((ulong)(OVar6 * 4));
            poVar7->m_mct_decoding_matrix = pOVar8;
            if (pOVar8 == (OPJ_FLOAT32 *)0x0) {
              return 0;
            }
            (*j2k_mct_read_functions_to_float[JVar1])(poVar4->m_data,pOVar8,OVar6);
          }
          poVar4 = poVar3->m_offset_array;
          if (poVar4 != (opj_mct_data_t *)0x0) {
            JVar1 = poVar4->m_element_type;
            OVar6 = poVar2->numcomps;
            if (poVar4->m_data_size != MCT_ELEMENT_SIZE[JVar1] * OVar6) {
              return 0;
            }
            __ptr = malloc((ulong)(OVar6 * 4));
            if (__ptr == (void *)0x0) {
              return 0;
            }
            (*j2k_mct_read_functions_to_int32[JVar1])(poVar4->m_data,__ptr,OVar6);
            OVar6 = poVar2->numcomps;
            pOVar10 = &poVar7->tccps->m_dc_level_shift;
            for (lVar11 = 0; OVar6 != (OPJ_UINT32)lVar11; lVar11 = lVar11 + 1) {
              *pOVar10 = *(OPJ_INT32 *)((long)__ptr + lVar11 * 4);
              pOVar10 = pOVar10 + 0x10e;
            }
            free(__ptr);
          }
        }
LAB_0011e8ff:
        uVar12 = uVar12 + 1;
      } while( true );
    }
    iVar9 = 2;
  }
  opj_event_msg_v2(p_manager,iVar9,"Error reading MCO marker\n");
  return 0;
}

Assistant:

opj_bool j2k_read_mco (	opj_j2k_v2_t *p_j2k,
						OPJ_BYTE * p_header_data,
						OPJ_UINT32 p_header_size,
						struct opj_event_mgr * p_manager )
{
	OPJ_UINT32 l_tmp, i;
	OPJ_UINT32 l_nb_stages;
	opj_tcp_v2_t * l_tcp;
	opj_tccp_t * l_tccp;
	opj_image_t * l_image;
	opj_image_comp_t * l_img_comp;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	l_image = p_j2k->m_private_image;
	l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
			&p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
			p_j2k->m_specific_param.m_decoder.m_default_tcp;

	if (p_header_size < 1) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCO marker\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(p_header_data,&l_nb_stages,1);				/* Nmco : only one tranform stage*/
	++p_header_data;

	if (l_nb_stages > 1) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Cannot take in charge multiple transformation stages.\n");
		return OPJ_TRUE;
	}

	if (p_header_size != l_nb_stages + 1) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Error reading MCO marker\n");
		return OPJ_FALSE;
	}

	l_tccp = l_tcp->tccps;
	l_img_comp = l_image->comps;

	for (i=0;i<l_image->numcomps;++i) {
		l_tccp->m_dc_level_shift = 0;
		++l_tccp;
	}

	if (l_tcp->m_mct_decoding_matrix) {
		opj_free(l_tcp->m_mct_decoding_matrix);
		l_tcp->m_mct_decoding_matrix = 00;
	}

	for (i=0;i<l_nb_stages;++i) {
		opj_read_bytes(p_header_data,&l_tmp,1);
		++p_header_data;

		if (! j2k_add_mct(l_tcp,p_j2k->m_private_image,l_tmp)) {
			return OPJ_FALSE;
		}
	}

	return OPJ_TRUE;
}